

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> __thiscall
llvm::DWARFContext::create
          (DWARFContext *this,
          StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
          *Sections,uint8_t AddrSize,bool isLittleEndian)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  StringMapEntryBase *pSVar3;
  size_t sVar4;
  StringMapEntryBase *pSVar5;
  vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  *pvVar6;
  DWARFObjInMemory *pDVar7;
  DWARFContext *this_00;
  ulong uVar8;
  pointer __p;
  DWARFSectionMap *pDVar9;
  _Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false> _Var10;
  _Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false> _Var11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  _Head_base<0UL,_const_llvm::DWARFObject_*,_false> local_b8;
  DWARFSectionMap *local_b0;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_a8;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_a0;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_98;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_90;
  DataRefImpl local_88;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false> local_60;
  __single_object DObj;
  
  pDVar7 = (DWARFObjInMemory *)operator_new(0x5f8);
  (pDVar7->super_DWARFObject).Dummy.Data = (StringRef)0x0;
  (pDVar7->super_DWARFObject)._vptr_DWARFObject = (_func_int **)&PTR__DWARFObjInMemory_00d8c958;
  pDVar7->IsLittleEndian = isLittleEndian;
  pDVar7->AddressSize = '\x04';
  local_90 = &pDVar7->InfoSections;
  p_Var1 = &(pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (pDVar7->FileName).Data = (char *)0x0;
  (pDVar7->FileName).Length = 0;
  pDVar7->Obj = (ObjectFile *)0x0;
  (pDVar7->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar7->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar7->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])&(pDVar7->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count
       = (undefined1  [16])0x0;
  pvVar6 = &(pDVar7->InfoSections).Vector;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = &pDVar7->TypesSections;
  p_Var1 = &(pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  pvVar6 = &(pDVar7->TypesSections).Vector;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pDVar7->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  local_98 = &pDVar7->InfoDWOSections;
  p_Var1 = &(pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(pDVar7->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar6 = &(pDVar7->InfoDWOSections).Vector;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = &pDVar7->TypesDWOSections;
  p_Var1 = &(pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pDVar7->LoclistsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->LoclistsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->LoclistsSection).Relocs.NumEntries = 0;
  (pDVar7->LoclistsSection).Relocs.NumTombstones = 0;
  (pDVar7->LoclistsSection).Relocs.NumBuckets = 0;
  (pDVar7->LineSection).Relocs.NumBuckets = 0;
  (pDVar7->LineSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->LineSection).Relocs.NumEntries = 0;
  (pDVar7->LineSection).Relocs.NumTombstones = 0;
  (pDVar7->LineSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->RangesSection).Relocs.NumBuckets = 0;
  (pDVar7->RangesSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->RangesSection).Relocs.NumEntries = 0;
  (pDVar7->RangesSection).Relocs.NumTombstones = 0;
  (pDVar7->RangesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->RnglistsSection).Relocs.NumBuckets = 0;
  (pDVar7->RnglistsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->RnglistsSection).Relocs.NumEntries = 0;
  (pDVar7->RnglistsSection).Relocs.NumTombstones = 0;
  (pDVar7->RnglistsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->StrOffsetsSection).Relocs.NumBuckets = 0;
  (pDVar7->StrOffsetsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->StrOffsetsSection).Relocs.NumEntries = 0;
  (pDVar7->StrOffsetsSection).Relocs.NumTombstones = 0;
  (pDVar7->StrOffsetsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->LineDWOSection).Relocs.NumBuckets = 0;
  (pDVar7->LineDWOSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0
  ;
  (pDVar7->LineDWOSection).Relocs.NumEntries = 0;
  (pDVar7->LineDWOSection).Relocs.NumTombstones = 0;
  (pDVar7->LineDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->FrameSection).Relocs.NumBuckets = 0;
  (pDVar7->FrameSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->FrameSection).Relocs.NumEntries = 0;
  (pDVar7->FrameSection).Relocs.NumTombstones = 0;
  (pDVar7->FrameSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->EHFrameSection).Relocs.NumBuckets = 0;
  (pDVar7->EHFrameSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0
  ;
  (pDVar7->EHFrameSection).Relocs.NumEntries = 0;
  (pDVar7->EHFrameSection).Relocs.NumTombstones = 0;
  (pDVar7->EHFrameSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->LocDWOSection).Relocs.NumBuckets = 0;
  (pDVar7->LocDWOSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->LocDWOSection).Relocs.NumEntries = 0;
  (pDVar7->LocDWOSection).Relocs.NumTombstones = 0;
  (pDVar7->LocDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->StrOffsetsDWOSection).Relocs.NumBuckets = 0;
  (pDVar7->StrOffsetsDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->StrOffsetsDWOSection).Relocs.NumEntries = 0;
  (pDVar7->StrOffsetsDWOSection).Relocs.NumTombstones = 0;
  (pDVar7->StrOffsetsDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->RangesDWOSection).Relocs.NumBuckets = 0;
  (pDVar7->RangesDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->RangesDWOSection).Relocs.NumEntries = 0;
  (pDVar7->RangesDWOSection).Relocs.NumTombstones = 0;
  (pDVar7->RangesDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->RnglistsDWOSection).Relocs.NumBuckets = 0;
  (pDVar7->RnglistsDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->RnglistsDWOSection).Relocs.NumEntries = 0;
  (pDVar7->RnglistsDWOSection).Relocs.NumTombstones = 0;
  (pDVar7->RnglistsDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->AddrSection).Relocs.NumBuckets = 0;
  (pDVar7->AddrSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->AddrSection).Relocs.NumEntries = 0;
  (pDVar7->AddrSection).Relocs.NumTombstones = 0;
  (pDVar7->AddrSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->AppleNamesSection).Relocs.NumBuckets = 0;
  (pDVar7->AppleNamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->AppleNamesSection).Relocs.NumEntries = 0;
  (pDVar7->AppleNamesSection).Relocs.NumTombstones = 0;
  (pDVar7->AppleNamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->AppleTypesSection).Relocs.NumBuckets = 0;
  (pDVar7->AppleTypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->AppleTypesSection).Relocs.NumEntries = 0;
  (pDVar7->AppleTypesSection).Relocs.NumTombstones = 0;
  (pDVar7->AppleTypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->AppleNamespacesSection).Relocs.NumBuckets = 0;
  (pDVar7->AppleNamespacesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->AppleNamespacesSection).Relocs.NumEntries = 0;
  (pDVar7->AppleNamespacesSection).Relocs.NumTombstones = 0;
  (pDVar7->AppleNamespacesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->AppleObjCSection).Relocs.NumBuckets = 0;
  (pDVar7->AppleObjCSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->AppleObjCSection).Relocs.NumEntries = 0;
  (pDVar7->AppleObjCSection).Relocs.NumTombstones = 0;
  (pDVar7->AppleObjCSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->NamesSection).Relocs.NumBuckets = 0;
  (pDVar7->NamesSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->NamesSection).Relocs.NumEntries = 0;
  (pDVar7->NamesSection).Relocs.NumTombstones = 0;
  (pDVar7->NamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->PubnamesSection).Relocs.NumBuckets = 0;
  (pDVar7->PubnamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->PubnamesSection).Relocs.NumEntries = 0;
  (pDVar7->PubnamesSection).Relocs.NumTombstones = 0;
  (pDVar7->PubnamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->PubtypesSection).Relocs.NumBuckets = 0;
  (pDVar7->PubtypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->PubtypesSection).Relocs.NumEntries = 0;
  (pDVar7->PubtypesSection).Relocs.NumTombstones = 0;
  (pDVar7->PubtypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->GnuPubnamesSection).Relocs.NumBuckets = 0;
  (pDVar7->GnuPubnamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->GnuPubnamesSection).Relocs.NumEntries = 0;
  (pDVar7->GnuPubnamesSection).Relocs.NumTombstones = 0;
  (pDVar7->GnuPubnamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->GnuPubtypesSection).Relocs.NumBuckets = 0;
  (pDVar7->GnuPubtypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->GnuPubtypesSection).Relocs.NumEntries = 0;
  (pDVar7->GnuPubtypesSection).Relocs.NumTombstones = 0;
  (pDVar7->GnuPubtypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar7->LocSection).Relocs.NumBuckets = 0;
  (pDVar7->LocSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar7->LocSection).Relocs.NumEntries = 0;
  (pDVar7->LocSection).Relocs.NumTombstones = 0;
  (pDVar7->LocSection).super_DWARFSection.Data = (StringRef)0x0;
  pvVar6 = &(pDVar7->TypesDWOSections).Vector;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pDVar7->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  memset(&pDVar7->AbbrevSection,0,0xf0);
  std::_Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_>::
  _M_initialize_map(&(pDVar7->UncompressedSections).
                     super__Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_>
                    ,0);
  _Var10._M_head_impl = (DWARFObjInMemory *)(Sections->super_StringMapImpl).TheTable;
  uVar8 = (ulong)(Sections->super_StringMapImpl).NumBuckets;
  _Var11._M_head_impl = _Var10._M_head_impl;
  if (uVar8 != 0) {
    for (; (*(StringMapEntryBase **)_Var11._M_head_impl == (StringMapEntryBase *)0x0 ||
           (*(StringMapEntryBase **)_Var11._M_head_impl == (StringMapEntryBase *)0xfffffffffffffff8)
           ); _Var11._M_head_impl = _Var11._M_head_impl + 8) {
    }
  }
  _Var10._M_head_impl =
       (DWARFObjInMemory *)(&((_Var10._M_head_impl)->super_DWARFObject)._vptr_DWARFObject + uVar8);
  if (_Var11._M_head_impl != _Var10._M_head_impl) {
    local_b0 = &pDVar7->AppleNamespacesSection;
    DObj._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
         (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
            )_Var10._M_head_impl;
    do {
      pSVar3 = (StringMapEntryBase *)((_Var11._M_head_impl)->super_DWARFObject)._vptr_DWARFObject;
      pSVar5 = pSVar3 + 2;
      sVar4 = pSVar3->StrLen;
      if (sVar4 == 9) {
        bVar15 = (char)pSVar3[3].StrLen == 'c';
        bVar16 = pSVar5->StrLen == 0x6f6c5f6775626564;
        bVar14 = bVar15 && bVar16;
        pDVar9 = (DWARFSectionMap *)0x0;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->LocSection;
        }
      }
      else {
        bVar14 = false;
        pDVar9 = (DWARFSectionMap *)0x0;
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x737473696c636f6c;
        bVar16 = pSVar5->StrLen == 0x6f6c5f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->LoclistsSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 10) && (!bVar14)) {
        bVar15 = (short)pSVar3[3].StrLen == 0x656e;
        bVar16 = pSVar5->StrLen == 0x696c5f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->LineSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xb) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 3) == 0x656d6172665f6775;
        bVar16 = pSVar5->StrLen == 0x72665f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->FrameSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 8) && (!bVar14)) {
        bVar15 = pSVar5->StrLen == 0x656d6172665f6865;
        if (bVar15) {
          pDVar9 = &pDVar7->EHFrameSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x11) && (!bVar14)) {
        auVar24[0] = -((char)pSVar3[4].StrLen == 's');
        auVar24[1] = 0xff;
        auVar24[2] = 0xff;
        auVar24[3] = 0xff;
        auVar24[4] = 0xff;
        auVar24[5] = 0xff;
        auVar24[6] = 0xff;
        auVar24[7] = 0xff;
        auVar24[8] = 0xff;
        auVar24[9] = 0xff;
        auVar24[10] = 0xff;
        auVar24[0xb] = 0xff;
        auVar24[0xc] = 0xff;
        auVar24[0xd] = 0xff;
        auVar24[0xe] = 0xff;
        auVar24[0xf] = 0xff;
        auVar17[0] = -((char)pSVar5->StrLen == 'd');
        auVar17[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
        auVar17[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
        auVar17[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
        auVar17[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
        auVar17[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar17[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 's');
        auVar17[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 't');
        auVar17[8] = -((char)pSVar3[3].StrLen == 'r');
        auVar17[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == '_');
        auVar17[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'o');
        auVar17[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'f');
        auVar17[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'f');
        auVar17[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 's');
        auVar17[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'e');
        auVar17[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 't');
        auVar17 = auVar17 & auVar24;
        bVar15 = (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = &pDVar7->StrOffsetsSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xc) && (!bVar14)) {
        bVar15 = (int)pSVar3[3].StrLen == 0x7365676e;
        bVar16 = pSVar5->StrLen == 0x61725f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->RangesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x737473696c676e72;
        bVar16 = pSVar5->StrLen == 0x6e725f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->RnglistsSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xd) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 5) == 0x6f77642e636f6c5f;
        bVar16 = pSVar5->StrLen == 0x6f6c5f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->LocDWOSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x6f77642e656e696c;
        bVar16 = pSVar5->StrLen == 0x696c5f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->LineDWOSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xb) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 3) == 0x73656d616e5f6775;
        bVar16 = pSVar5->StrLen == 0x616e5f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->NamesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x12) && (!bVar14)) {
        auVar18[0] = -((char)pSVar5->StrLen == 'd');
        auVar18[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
        auVar18[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
        auVar18[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
        auVar18[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
        auVar18[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar18[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 'r');
        auVar18[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 'n');
        auVar18[8] = -((char)pSVar3[3].StrLen == 'g');
        auVar18[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == 'l');
        auVar18[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'i');
        auVar18[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 's');
        auVar18[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 't');
        auVar18[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 's');
        auVar18[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == '.');
        auVar18[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 'd');
        uVar2 = (undefined2)pSVar3[4].StrLen;
        auVar25[0] = -((char)uVar2 == 'w');
        auVar25[1] = -((char)((ushort)uVar2 >> 8) == 'o');
        auVar25[2] = 0xff;
        auVar25[3] = 0xff;
        auVar25[4] = 0xff;
        auVar25[5] = 0xff;
        auVar25[6] = 0xff;
        auVar25[7] = 0xff;
        auVar25[8] = 0xff;
        auVar25[9] = 0xff;
        auVar25[10] = 0xff;
        auVar25[0xb] = 0xff;
        auVar25[0xc] = 0xff;
        auVar25[0xd] = 0xff;
        auVar25[0xe] = 0xff;
        auVar25[0xf] = 0xff;
        auVar25 = auVar25 & auVar18;
        bVar15 = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = &pDVar7->RnglistsDWOSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x15) && (!bVar14)) {
        auVar26[0] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar26[1] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 's');
        auVar26[2] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 't');
        auVar26[3] = -((char)pSVar3[3].StrLen == 'r');
        auVar26[4] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == '_');
        auVar26[5] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'o');
        auVar26[6] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'f');
        auVar26[7] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'f');
        auVar26[8] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 's');
        auVar26[9] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'e');
        auVar26[10] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 't');
        auVar26[0xb] = -((char)pSVar3[4].StrLen == 's');
        auVar26[0xc] = -(*(char *)((long)&pSVar3[4].StrLen + 1) == '.');
        auVar26[0xd] = -(*(char *)((long)&pSVar3[4].StrLen + 2) == 'd');
        auVar26[0xe] = -(*(char *)((long)&pSVar3[4].StrLen + 3) == 'w');
        auVar26[0xf] = -(*(char *)((long)&pSVar3[4].StrLen + 4) == 'o');
        auVar19[0] = -((char)pSVar5->StrLen == 'd');
        auVar19[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
        auVar19[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
        auVar19[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
        auVar19[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
        auVar19[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar19[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 's');
        auVar19[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 't');
        auVar19[8] = -((char)pSVar3[3].StrLen == 'r');
        auVar19[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == '_');
        auVar19[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'o');
        auVar19[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'f');
        auVar19[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'f');
        auVar19[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 's');
        auVar19[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'e');
        auVar19[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 't');
        auVar19 = auVar19 & auVar26;
        bVar15 = (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = &pDVar7->StrOffsetsDWOSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 10) && (!bVar14)) {
        bVar15 = (short)pSVar3[3].StrLen == 0x7264;
        bVar16 = pSVar5->StrLen == 0x64615f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->AddrSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xb) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 3) == 0x73656d616e5f656c;
        bVar16 = pSVar5->StrLen == 0x616e5f656c707061;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->AppleNamesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x73656d616e627570;
        bVar16 = pSVar5->StrLen == 0x75705f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->PubnamesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x7365707974627570;
        bVar16 = pSVar5->StrLen == 0x75705f6775626564;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->PubtypesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x12) && (!bVar14)) {
        auVar20[0] = -((char)pSVar5->StrLen == 'd');
        auVar20[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
        auVar20[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
        auVar20[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
        auVar20[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
        auVar20[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar20[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 'g');
        auVar20[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 'n');
        auVar20[8] = -((char)pSVar3[3].StrLen == 'u');
        auVar20[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == '_');
        auVar20[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'p');
        auVar20[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'u');
        auVar20[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'b');
        auVar20[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 'n');
        auVar20[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'a');
        auVar20[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 'm');
        uVar2 = (undefined2)pSVar3[4].StrLen;
        auVar27[0] = -((char)uVar2 == 'e');
        auVar27[1] = -((char)((ushort)uVar2 >> 8) == 's');
        auVar27[2] = 0xff;
        auVar27[3] = 0xff;
        auVar27[4] = 0xff;
        auVar27[5] = 0xff;
        auVar27[6] = 0xff;
        auVar27[7] = 0xff;
        auVar27[8] = 0xff;
        auVar27[9] = 0xff;
        auVar27[10] = 0xff;
        auVar27[0xb] = 0xff;
        auVar27[0xc] = 0xff;
        auVar27[0xd] = 0xff;
        auVar27[0xe] = 0xff;
        auVar27[0xf] = 0xff;
        auVar27 = auVar27 & auVar20;
        bVar15 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = &pDVar7->GnuPubnamesSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x12) && (!bVar14)) {
        auVar21[0] = -((char)pSVar5->StrLen == 'd');
        auVar21[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
        auVar21[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
        auVar21[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
        auVar21[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
        auVar21[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar21[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 'g');
        auVar21[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 'n');
        auVar21[8] = -((char)pSVar3[3].StrLen == 'u');
        auVar21[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == '_');
        auVar21[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'p');
        auVar21[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'u');
        auVar21[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'b');
        auVar21[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 't');
        auVar21[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'y');
        auVar21[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 'p');
        uVar2 = (undefined2)pSVar3[4].StrLen;
        auVar28[0] = -((char)uVar2 == 'e');
        auVar28[1] = -((char)((ushort)uVar2 >> 8) == 's');
        auVar28[2] = 0xff;
        auVar28[3] = 0xff;
        auVar28[4] = 0xff;
        auVar28[5] = 0xff;
        auVar28[6] = 0xff;
        auVar28[7] = 0xff;
        auVar28[8] = 0xff;
        auVar28[9] = 0xff;
        auVar28[10] = 0xff;
        auVar28[0xb] = 0xff;
        auVar28[0xc] = 0xff;
        auVar28[0xd] = 0xff;
        auVar28[0xe] = 0xff;
        auVar28[0xf] = 0xff;
        auVar28 = auVar28 & auVar21;
        bVar15 = (ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = &pDVar7->GnuPubtypesSection;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xb) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 3) == 0x73657079745f656c;
        bVar16 = pSVar5->StrLen == 0x79745f656c707061;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->AppleTypesSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0x10) && (!bVar14)) {
        auVar22[0] = -((char)pSVar5->StrLen == 'a');
        auVar22[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'p');
        auVar22[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'p');
        auVar22[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'l');
        auVar22[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'e');
        auVar22[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
        auVar22[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 'n');
        auVar22[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 'a');
        auVar22[8] = -((char)pSVar3[3].StrLen == 'm');
        auVar22[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == 'e');
        auVar22[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 's');
        auVar22[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'p');
        auVar22[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == 'a');
        auVar22[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 'c');
        auVar22[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'e');
        auVar22[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 's');
        bVar15 = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar15) {
          pDVar9 = local_b0;
        }
        bVar14 = false;
        if (bVar15) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 0xe) && (!bVar14)) {
        bVar15 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x63617073656d616e;
        bVar16 = pSVar5->StrLen == 0x616e5f656c707061;
        if (bVar15 && bVar16) {
          pDVar9 = local_b0;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if ((sVar4 == 10) && (!bVar14)) {
        bVar15 = (short)pSVar3[3].StrLen == 0x636a;
        bVar16 = pSVar5->StrLen == 0x626f5f656c707061;
        if (bVar15 && bVar16) {
          pDVar9 = &pDVar7->AppleObjCSection;
        }
        bVar14 = false;
        if (bVar15 && bVar16) {
          bVar14 = true;
        }
      }
      if (!bVar14) {
        pDVar9 = (DWARFSectionMap *)0x0;
      }
      if (pDVar9 == (DWARFSectionMap *)0x0) {
        if (sVar4 == 0xc) {
          bVar16 = (int)pSVar3[3].StrLen == 0x76657262;
          bVar14 = pSVar5->StrLen == 0x62615f6775626564;
          bVar15 = bVar16 && bVar14;
          pDVar9 = (DWARFSectionMap *)0x0;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->AbbrevSection;
          }
        }
        else {
          bVar15 = false;
          pDVar9 = (DWARFSectionMap *)0x0;
        }
        if ((sVar4 == 0xd) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 5) == 0x7365676e6172615f;
          bVar14 = pSVar5->StrLen == 0x72615f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->ArangesSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 9) && (!bVar15)) {
          bVar16 = (char)pSVar3[3].StrLen == 'r';
          bVar14 = pSVar5->StrLen == 0x74735f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->StrSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0xd) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 5) == 0x6f666e6963616d5f;
          bVar14 = pSVar5->StrLen == 0x616d5f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->MacinfoSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0x10) && (!bVar15)) {
          auVar23[0] = -((char)pSVar5->StrLen == 'd');
          auVar23[1] = -(*(char *)((long)&pSVar3[2].StrLen + 1) == 'e');
          auVar23[2] = -(*(char *)((long)&pSVar3[2].StrLen + 2) == 'b');
          auVar23[3] = -(*(char *)((long)&pSVar3[2].StrLen + 3) == 'u');
          auVar23[4] = -(*(char *)((long)&pSVar3[2].StrLen + 4) == 'g');
          auVar23[5] = -(*(char *)((long)&pSVar3[2].StrLen + 5) == '_');
          auVar23[6] = -(*(char *)((long)&pSVar3[2].StrLen + 6) == 'a');
          auVar23[7] = -(*(char *)((long)&pSVar3[2].StrLen + 7) == 'b');
          auVar23[8] = -((char)pSVar3[3].StrLen == 'b');
          auVar23[9] = -(*(char *)((long)&pSVar3[3].StrLen + 1) == 'r');
          auVar23[10] = -(*(char *)((long)&pSVar3[3].StrLen + 2) == 'e');
          auVar23[0xb] = -(*(char *)((long)&pSVar3[3].StrLen + 3) == 'v');
          auVar23[0xc] = -(*(char *)((long)&pSVar3[3].StrLen + 4) == '.');
          auVar23[0xd] = -(*(char *)((long)&pSVar3[3].StrLen + 5) == 'd');
          auVar23[0xe] = -(*(char *)((long)&pSVar3[3].StrLen + 6) == 'w');
          auVar23[0xf] = -(*(char *)((long)&pSVar3[3].StrLen + 7) == 'o');
          bVar16 = (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar23[0xf] >> 7) << 0xf) == 0xffff;
          if (bVar16) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->AbbrevDWOSection;
          }
          bVar15 = false;
          if (bVar16) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0xd) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 5) == 0x6f77642e7274735f;
          bVar14 = pSVar5->StrLen == 0x74735f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->StrDWOSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0xe) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x7865646e695f7563;
          bVar14 = pSVar5->StrLen == 0x75635f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->CUIndexSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0xe) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x7865646e695f7574;
          bVar14 = pSVar5->StrLen == 0x75745f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->TUIndexSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 9) && (!bVar15)) {
          bVar16 = (char)pSVar3[3].StrLen == 'x';
          bVar14 = pSVar5->StrLen == 0x65646e695f626467;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->GdbIndexSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if ((sVar4 == 0xe) && (!bVar15)) {
          bVar16 = *(long *)((long)&pSVar3[2].StrLen + 6) == 0x7274735f656e696c;
          bVar14 = pSVar5->StrLen == 0x696c5f6775626564;
          if (bVar16 && bVar14) {
            pDVar9 = (DWARFSectionMap *)&pDVar7->LineStrSection;
          }
          bVar15 = false;
          if (bVar16 && bVar14) {
            bVar15 = true;
          }
        }
        if (!bVar15) {
          pDVar9 = (DWARFSectionMap *)0x0;
        }
      }
      if (pDVar9 == (DWARFSectionMap *)0x0) {
        switch(sVar4) {
        case 10:
          if ((short)pSVar3[3].StrLen == 0x6f66 && pSVar5->StrLen == 0x6e695f6775626564) {
            pcVar12 = *(char **)(pSVar3[1].StrLen + 8);
            lVar13 = *(long *)(pSVar3[1].StrLen + 0x10);
            _local_88 = (undefined1  [16])0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[](local_90,(SectionRef *)&local_88.d);
            goto LAB_00af27b0;
          }
          if (sVar4 == 0xb) goto switchD_00af262e_caseD_b;
          if (sVar4 == 0xf) goto switchD_00af262e_caseD_f;
          if (sVar4 == 0xe) goto switchD_00af262e_caseD_e;
          break;
        case 0xb:
switchD_00af262e_caseD_b:
          if (*(long *)((long)&pSVar3[2].StrLen + 3) == 0x73657079745f6775 &&
              pSVar5->StrLen == 0x79745f6775626564) {
            pcVar12 = *(char **)(pSVar3[1].StrLen + 8);
            lVar13 = *(long *)(pSVar3[1].StrLen + 0x10);
            _local_88 = (undefined1  [16])0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[](local_a0,(SectionRef *)&local_88.d);
            goto LAB_00af27b0;
          }
          if (sVar4 == 0xf) goto switchD_00af262e_caseD_f;
          break;
        case 0xe:
switchD_00af262e_caseD_e:
          if (*(long *)((long)&pSVar3[2].StrLen + 6) == 0x6f77642e6f666e69 &&
              pSVar5->StrLen == 0x6e695f6775626564) {
            pcVar12 = *(char **)(pSVar3[1].StrLen + 8);
            lVar13 = *(long *)(pSVar3[1].StrLen + 0x10);
            _local_88 = (undefined1  [16])0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[](local_98,(SectionRef *)&local_88.d);
            goto LAB_00af27b0;
          }
          if (sVar4 == 0xf) goto switchD_00af262e_caseD_f;
          if (sVar4 == 0xb) goto switchD_00af262e_caseD_b;
          break;
        case 0xf:
switchD_00af262e_caseD_f:
          if (*(long *)((long)&pSVar3[2].StrLen + 7) == 0x6f77642e73657079 &&
              pSVar5->StrLen == 0x79745f6775626564) {
            pcVar12 = *(char **)(pSVar3[1].StrLen + 8);
            lVar13 = *(long *)(pSVar3[1].StrLen + 0x10);
            _local_88 = (undefined1  [16])0x0;
            pDVar9 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                     ::operator[](local_a8,(SectionRef *)&local_88.d);
LAB_00af27b0:
            (pDVar9->super_DWARFSection).Data.Data = pcVar12;
            (pDVar9->super_DWARFSection).Data.Length = lVar13 - (long)pcVar12;
            _Var10._M_head_impl =
                 (DWARFObjInMemory *)
                 DObj._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                 _M_head_impl;
          }
        }
      }
      else {
        pcVar12 = *(char **)(pSVar3[1].StrLen + 8);
        lVar13 = *(long *)(pSVar3[1].StrLen + 0x10);
        (pDVar9->super_DWARFSection).Data.Data = pcVar12;
        (pDVar9->super_DWARFSection).Data.Length = lVar13 - (long)pcVar12;
      }
      do {
        do {
          _Var11._M_head_impl = _Var11._M_head_impl + 8;
          pSVar5 = (StringMapEntryBase *)
                   ((_Var11._M_head_impl)->super_DWARFObject)._vptr_DWARFObject;
        } while (pSVar5 == (StringMapEntryBase *)0x0);
      } while (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (_Var11._M_head_impl != _Var10._M_head_impl);
  }
  local_60._M_head_impl = pDVar7;
  this_00 = (DWARFContext *)operator_new(0x180);
  local_60._M_head_impl = (DWARFObjInMemory *)0x0;
  uStack_80 = 0;
  local_88 = (DataRefImpl)&local_78;
  local_78._M_local_buf[0] = '\0';
  local_b8._M_head_impl = (DWARFObject *)pDVar7;
  DWARFContext(this_00,(unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                        *)&local_b8,(string *)&local_88.d);
  (this->super_DIContext)._vptr_DIContext = (_func_int **)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.p != &local_78) {
    operator_delete((void *)local_88,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (local_b8._M_head_impl != (DWARFObject *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_DWARFObject[1])();
  }
  std::
  unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 *)&local_60);
  return (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
         (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<DWARFContext>
DWARFContext::create(const StringMap<std::unique_ptr<MemoryBuffer>> &Sections,
                     uint8_t AddrSize, bool isLittleEndian) {
  auto DObj =
      std::make_unique<DWARFObjInMemory>(Sections, AddrSize, isLittleEndian);
  return std::make_unique<DWARFContext>(std::move(DObj), "");
}